

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O3

_Bool nbt_map(nbt_node *tree,nbt_visitor_t v,void *aux)

{
  _Bool _Var1;
  _Bool _Var2;
  nbt_type nVar3;
  nbt_list *pnVar4;
  list_head *plVar5;
  
  if (v == (nbt_visitor_t)0x0) {
    __assert_fail("v",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xc9,"_Bool nbt_map(nbt_node *, nbt_visitor_t, void *)");
  }
  _Var2 = true;
  if (tree != (nbt_node *)0x0) {
    _Var1 = (*v)(tree,aux);
    if (_Var1) {
      nVar3 = tree->type;
      if (nVar3 == TAG_COMPOUND) {
        plVar5 = (((tree->payload).tag_list)->entry).flink;
        if (plVar5 == &((tree->payload).tag_list)->entry) {
          return true;
        }
        do {
          _Var1 = nbt_map((nbt_node *)plVar5[-1].flink,v,aux);
          if (!_Var1) goto LAB_00102d91;
          plVar5 = plVar5->flink;
        } while (plVar5 != &((tree->payload).tag_list)->entry);
        nVar3 = tree->type;
      }
      if (nVar3 == TAG_LIST) {
        pnVar4 = (tree->payload).tag_list;
        for (plVar5 = (pnVar4->entry).flink; plVar5 != &pnVar4->entry; plVar5 = plVar5->flink) {
          _Var2 = nbt_map((nbt_node *)plVar5[-1].flink,v,aux);
          if (!_Var2) {
            return _Var2;
          }
          pnVar4 = (tree->payload).tag_list;
        }
      }
    }
    else {
LAB_00102d91:
      _Var2 = false;
    }
  }
  return _Var2;
}

Assistant:

bool nbt_map(nbt_node* tree, nbt_visitor_t v, void* aux)
{
    assert(v);

    if(tree == NULL)  return true;
    if(!v(tree, aux)) return false;

    /* And if the item is a list or compound, recurse through each of their elements. */
    if(tree->type == TAG_COMPOUND)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_compound->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }
    
    if(tree->type == TAG_LIST)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_list->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }

    return true;
}